

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall
kj::ArrayOutputStream::write(ArrayOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_1;
  undefined4 in_register_00000034;
  byte *pbVar1;
  Fault f;
  size_t size_local;
  byte *local_18;
  
  params_1 = &this->fillPos;
  pbVar1 = this->fillPos;
  size_local = (size_t)__buf;
  if ((pbVar1 == (byte *)CONCAT44(in_register_00000034,__fd)) &&
     (local_18 = (this->array).ptr + (this->array).size_, pbVar1 != local_18)) {
    local_18 = local_18 + -(long)pbVar1;
    if (local_18 < __buf) {
      _::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x114,FAILED,"size <= array.end() - fillPos",
                 "size, fillPos, array.end() - fillPos",&size_local,params_1,(long *)&local_18);
      _::Debug::Fault::fatal(&f);
    }
    pbVar1 = pbVar1 + (long)__buf;
  }
  else {
    if ((this->array).ptr + ((this->array).size_ - (long)pbVar1) < __buf) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[77]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x118,FAILED,"size <= (size_t)(array.end() - fillPos)",
                 "\"ArrayOutputStream\'s backing array was not large enough for the data written.\""
                 ,(char (*) [77])
                  "ArrayOutputStream\'s backing array was not large enough for the data written.");
      _::Debug::Fault::fatal(&f);
    }
    this = (ArrayOutputStream *)
           memcpy(pbVar1,(byte *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    pbVar1 = *params_1 + size_local;
  }
  *params_1 = pbVar1;
  return (ssize_t)this;
}

Assistant:

void ArrayOutputStream::write(const void* src, size_t size) {
  if (src == fillPos && fillPos != array.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= array.end() - fillPos, size, fillPos, array.end() - fillPos);
    fillPos += size;
  } else {
    KJ_REQUIRE(size <= (size_t)(array.end() - fillPos),
            "ArrayOutputStream's backing array was not large enough for the data written.");
    memcpy(fillPos, src, size);
    fillPos += size;
  }
}